

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j,short *data,stbi__huffman *hdc,int b)

{
  byte bVar1;
  stbi__uint32 sVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  
  if (j->spec_end == 0) {
    if (j->code_bits < 0x10) {
      stbi__grow_buffer_unsafe(j);
    }
    if (j->succ_high == 0) {
      data[0x38] = 0;
      data[0x39] = 0;
      data[0x3a] = 0;
      data[0x3b] = 0;
      data[0x3c] = 0;
      data[0x3d] = 0;
      data[0x3e] = 0;
      data[0x3f] = 0;
      data[0x30] = 0;
      data[0x31] = 0;
      data[0x32] = 0;
      data[0x33] = 0;
      data[0x34] = 0;
      data[0x35] = 0;
      data[0x36] = 0;
      data[0x37] = 0;
      data[0x28] = 0;
      data[0x29] = 0;
      data[0x2a] = 0;
      data[0x2b] = 0;
      data[0x2c] = 0;
      data[0x2d] = 0;
      data[0x2e] = 0;
      data[0x2f] = 0;
      data[0x20] = 0;
      data[0x21] = 0;
      data[0x22] = 0;
      data[0x23] = 0;
      data[0x24] = 0;
      data[0x25] = 0;
      data[0x26] = 0;
      data[0x27] = 0;
      data[0x18] = 0;
      data[0x19] = 0;
      data[0x1a] = 0;
      data[0x1b] = 0;
      data[0x1c] = 0;
      data[0x1d] = 0;
      data[0x1e] = 0;
      data[0x1f] = 0;
      data[0x10] = 0;
      data[0x11] = 0;
      data[0x12] = 0;
      data[0x13] = 0;
      data[0x14] = 0;
      data[0x15] = 0;
      data[0x16] = 0;
      data[0x17] = 0;
      data[8] = 0;
      data[9] = 0;
      data[10] = 0;
      data[0xb] = 0;
      data[0xc] = 0;
      data[0xd] = 0;
      data[0xe] = 0;
      data[0xf] = 0;
      data[0] = 0;
      data[1] = 0;
      data[2] = 0;
      data[3] = 0;
      data[4] = 0;
      data[5] = 0;
      data[6] = 0;
      data[7] = 0;
      if (j->code_bits < 0x10) {
        stbi__grow_buffer_unsafe(j);
      }
      uVar3 = j->code_buffer;
      uVar6 = (ulong)hdc->fast[uVar3 >> 0x17];
      if (uVar6 == 0xff) {
        lVar9 = 0;
        do {
          lVar8 = lVar9;
          lVar9 = lVar8 + 1;
        } while (hdc->maxcode[lVar8 + 10] <= uVar3 >> 0x10);
        iVar5 = j->code_bits;
        if (lVar9 == 8) {
          j->code_bits = iVar5 + -0x10;
          uVar11 = 0xffffffff;
        }
        else {
          uVar11 = 0xffffffff;
          if ((int)(lVar8 + 10) <= iVar5) {
            iVar10 = (uVar3 >> (0x17U - (char)lVar9 & 0x1f) & stbi__bmask[lVar8 + 10]) +
                     hdc->delta[lVar8 + 10];
            if ((uVar3 >> (-hdc->size[iVar10] & 0x1f) & stbi__bmask[hdc->size[iVar10]]) !=
                (uint)hdc->code[iVar10]) {
              __assert_fail("(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/yangheng111[P]MNN_Pc_demo/./includes/3rd_party/imageHelper/stb_image.h"
                            ,0x7a0,"int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)");
            }
            j->code_bits = (iVar5 - (int)lVar9) + -9;
            j->code_buffer = uVar3 << ((byte)(lVar8 + 10) & 0x1f);
            uVar11 = (uint)hdc->values[iVar10];
          }
        }
      }
      else {
        bVar1 = hdc->size[uVar6];
        uVar11 = 0xffffffff;
        if ((int)(uint)bVar1 <= j->code_bits) {
          j->code_buffer = uVar3 << (bVar1 & 0x1f);
          j->code_bits = j->code_bits - (uint)bVar1;
          uVar11 = (uint)hdc->values[uVar6];
        }
      }
      if (uVar11 == 0) {
        iVar5 = 0;
      }
      else {
        if (j->code_bits < (int)uVar11) {
          stbi__grow_buffer_unsafe(j);
        }
        if (0x10 < uVar11) {
          __assert_fail("n >= 0 && n < (int) (sizeof(stbi__bmask)/sizeof(*stbi__bmask))",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/yangheng111[P]MNN_Pc_demo/./includes/3rd_party/imageHelper/stb_image.h"
                        ,0x7b5,"int stbi__extend_receive(stbi__jpeg *, int)");
        }
        uVar3 = j->code_buffer;
        bVar1 = (byte)uVar11 & 0x1f;
        uVar7 = uVar3 << bVar1 | uVar3 >> 0x20 - bVar1;
        uVar4 = stbi__bmask[uVar11];
        j->code_buffer = ~uVar4 & uVar7;
        j->code_bits = j->code_bits - uVar11;
        iVar5 = 0;
        if (-1 < (int)uVar3) {
          iVar5 = stbi__jbias[uVar11];
        }
        iVar5 = iVar5 + (uVar7 & uVar4);
      }
      iVar5 = iVar5 + j->img_comp[b].dc_pred;
      j->img_comp[b].dc_pred = iVar5;
      *data = (short)(iVar5 << ((byte)j->succ_low & 0x1f));
      iVar5 = 1;
    }
    else {
      if (j->code_bits < 1) {
        stbi__grow_buffer_unsafe(j);
      }
      sVar2 = j->code_buffer;
      j->code_buffer = sVar2 * 2;
      j->code_bits = j->code_bits + -1;
      iVar5 = 1;
      if ((int)sVar2 < 0) {
        *data = *data + (short)(1 << ((byte)j->succ_low & 0x1f));
      }
    }
  }
  else {
    stbi__g_failure_reason = "can\'t merge dc and ac";
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j, short data[64], stbi__huffman *hdc, int b)
{
   int diff,dc;
   int t;
   if (j->spec_end != 0) return stbi__err("can't merge dc and ac", "Corrupt JPEG");

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);

   if (j->succ_high == 0) {
      // first scan for DC coefficient, must be first
      memset(data,0,64*sizeof(data[0])); // 0 all the ac values now
      t = stbi__jpeg_huff_decode(j, hdc);
      diff = t ? stbi__extend_receive(j, t) : 0;

      dc = j->img_comp[b].dc_pred + diff;
      j->img_comp[b].dc_pred = dc;
      data[0] = (short) (dc << j->succ_low);
   } else {
      // refinement scan for DC coefficient
      if (stbi__jpeg_get_bit(j))
         data[0] += (short) (1 << j->succ_low);
   }
   return 1;
}